

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::rd_string
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,char *str_input,unsigned_fast_type count
          ,int base_hint)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  representation_type *prVar8;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 local_50 [16];
  value_type_conflict vStack_40;
  undefined1 auStack_3c [12];
  
  prVar8 = &this->values;
  (prVar8->super_array<unsigned_int,_8UL>).elems[4] = 0;
  (prVar8->super_array<unsigned_int,_8UL>).elems[5] = 0;
  (prVar8->super_array<unsigned_int,_8UL>).elems[6] = 0;
  (prVar8->super_array<unsigned_int,_8UL>).elems[7] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[0] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0;
  (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      return true;
    }
    uVar15 = 0;
    do {
      count = uVar15 + 1;
      lVar13 = uVar15 + 1;
      uVar15 = count;
    } while (str_input[lVar13] != '\0');
  }
  if (count == 0) {
    if ((char)base_hint == '\0') {
      base_hint = 10;
    }
    bVar16 = false;
    count = 0;
    uVar15 = 0;
  }
  else {
    bVar16 = *str_input == '-';
    uVar15 = (ulong)(*str_input == '+' || bVar16);
    if ((char)base_hint == '\0') {
      base_hint = 10;
      if (uVar15 < count) {
        if (str_input[uVar15] == '0') {
          if ((byte)(str_input[uVar15 + 1] - 0x30U) < 9) {
            uVar15 = uVar15 + 1;
            base_hint = 8;
          }
          else if ((byte)(str_input[uVar15 + 1] | 0x20U) == 0x78) {
            uVar15 = uVar15 | 2;
            base_hint = 0x10;
          }
        }
      }
      else {
        count = 1;
        uVar15 = 1;
      }
    }
  }
  bVar14 = true;
  if (count <= uVar15) {
LAB_00130043:
    if (bVar16) {
      uVar5 = (this->values).super_array<unsigned_int,_8UL>.elems[1];
      uVar6 = (this->values).super_array<unsigned_int,_8UL>.elems[2];
      uVar7 = (this->values).super_array<unsigned_int,_8UL>.elems[3];
      uVar12 = (this->values).super_array<unsigned_int,_8UL>.elems[4];
      uVar2 = (this->values).super_array<unsigned_int,_8UL>.elems[5];
      uVar3 = (this->values).super_array<unsigned_int,_8UL>.elems[6];
      uVar4 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
      (this->values).super_array<unsigned_int,_8UL>.elems[0] =
           (this->values).super_array<unsigned_int,_8UL>.elems[0] ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[1] = uVar5 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[2] = uVar6 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[3] = uVar7 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[4] = uVar12 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[5] = uVar2 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[6] = uVar3 ^ 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[7] = uVar4 ^ 0xffffffff;
      lVar13 = 0;
      do {
        piVar1 = (int *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar13);
        *piVar1 = *piVar1 + 1;
        if (*piVar1 != 0) {
          return bVar14;
        }
        bVar16 = lVar13 != 0x1c;
        lVar13 = lVar13 + 4;
      } while (bVar16);
    }
    return bVar14;
  }
  do {
    bVar9 = str_input[uVar15];
    bVar14 = true;
    if (bVar9 != 0x27) {
      if ((char)base_hint == '\x10') {
        bVar11 = bVar9 - 0x30;
        bVar14 = (bVar11 < 10 || (byte)(bVar9 + 0xbf) < 6) || (byte)(bVar9 + 0x9f) < 6;
        if ((bVar11 < 10) ||
           ((bVar9 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar9 - 0x41) & 0x3f) & 1) != 0))))
        {
          if ((byte)(bVar9 + 0x9f) < 6) {
            bVar9 = bVar9 + 0xa9;
          }
          else if ((byte)(bVar9 + 0xbf) < 6) {
            bVar9 = bVar9 - 0x37;
          }
          else {
            bVar9 = bVar9 - 0x30;
            if (9 < bVar11) {
              bVar9 = 0;
            }
          }
          uVar12 = 0;
          lVar13 = 0;
          do {
            uVar2 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar13);
            *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar13) =
                 uVar2 << 4 | uVar12;
            lVar13 = lVar13 + 4;
            uVar12 = uVar2 >> 0x1c;
          } while (lVar13 != 0x20);
LAB_00130028:
          (this->values).super_array<unsigned_int,_8UL>.elems[0] =
               (this->values).super_array<unsigned_int,_8UL>.elems[0] | (uint)bVar9;
        }
      }
      else if ((base_hint & 0xffU) == 10) {
        if (9 < (byte)(bVar9 - 0x30)) goto LAB_00130040;
        lVar13 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 + (ulong)(this->values).super_array<unsigned_int,_8UL>.elems[lVar13] * 10;
          (this->values).super_array<unsigned_int,_8UL>.elems[lVar13] = (value_type_conflict)uVar10;
          uVar10 = uVar10 >> 0x20;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        auStack_3c = SUB1612((undefined1  [16])0x0,4);
        local_50._4_12_ = SUB1612((undefined1  [16])0x0,0);
        vStack_40 = 0;
        local_50._0_4_ = ZEXT14((byte)(bVar9 - 0x30));
        operator+=(this,(uintwide_t<256U,_unsigned_int,_void,_true> *)local_50);
      }
      else if ((base_hint & 0xffU) == 8) {
        bVar9 = bVar9 - 0x30;
        if (bVar9 < 9) {
          uVar12 = 0;
          lVar13 = 0;
          do {
            uVar2 = *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar13);
            *(uint *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar13) =
                 uVar12 + uVar2 * 8;
            lVar13 = lVar13 + 4;
            uVar12 = uVar2 >> 0x1d;
          } while (lVar13 != 0x20);
          goto LAB_00130028;
        }
LAB_00130040:
        bVar14 = false;
        goto LAB_00130043;
      }
    }
    uVar15 = uVar15 + 1;
    if ((count <= uVar15) || (bVar14 == false)) goto LAB_00130043;
  } while( true );
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }